

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

void __thiscall calculator::error::error(error *this,string *expr,string *message)

{
  string *in_RDX;
  string *in_RSI;
  runtime_error *in_RDI;
  
  std::runtime_error::runtime_error(in_RDI,in_RDX);
  *(undefined ***)in_RDI = &PTR__error_0021a6d0;
  std::__cxx11::string::string((string *)(in_RDI + 0x10),in_RSI);
  return;
}

Assistant:

error(const std::string& expr, const std::string& message)
    : std::runtime_error(message),
      expr_(expr)
  { }